

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.hpp
# Opt level: O0

rt_expr<viennamath::rt_expression_interface<double>_> __thiscall
viennamath::substitute<viennamath::rt_expression_interface<double>>
          (viennamath *this,rt_variable<viennamath::rt_expression_interface<double>_> *u,
          default_numeric_type repl,rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  rt_expression_interface<double> *prVar2;
  undefined4 extraout_var;
  undefined1 local_38 [8];
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c;
  rt_expr<viennamath::rt_expression_interface<double>_> *e_local;
  default_numeric_type repl_local;
  rt_variable<viennamath::rt_expression_interface<double>_> *u_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *temp;
  
  c.s = (double)e;
  rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,repl);
  prVar2 = rt_expr<viennamath::rt_expression_interface<double>_>::get
                     ((rt_expr<viennamath::rt_expression_interface<double>_> *)c.s);
  iVar1 = (*prVar2->_vptr_rt_expression_interface[0xe])
                    (prVar2,u,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
                              local_38);
  rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)this,
             (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1));
  inplace_simplify<viennamath::rt_expression_interface<double>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)this);
  rt_constant<double,_viennamath::rt_expression_interface<double>_>::~rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38);
  return (rt_expr<viennamath::rt_expression_interface<double>_>)
         (auto_ptr<const_viennamath::rt_expression_interface<double>_>)this;
}

Assistant:

rt_expr<InterfaceType> substitute(rt_variable<InterfaceType> const & u,
                                    default_numeric_type repl,
                                    rt_expr<InterfaceType> const & e)
  {
    rt_constant<default_numeric_type, InterfaceType> c(repl);
    rt_expr<InterfaceType> temp(e.get()->substitute(&u, &c));
    inplace_simplify(temp);
    return temp;
  }